

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarchingCube.cpp
# Opt level: O0

void __thiscall
MarchingCube::run(MarchingCube *this,Field<double,_unsigned_short> *F,uint64_t iteration)

{
  pointer *ppfVar1;
  pointer *this_00;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *this_01;
  double dVar2;
  double dVar3;
  double dVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  vec3 p2;
  vec3 p1;
  vec3 p2_00;
  vec3 p1_00;
  vec3 p2_01;
  vec3 p1_01;
  vec3 p2_02;
  vec3 p1_02;
  vec3 p2_03;
  vec3 p1_03;
  vec3 p2_04;
  vec3 p1_04;
  vec3 p2_05;
  vec3 p1_05;
  vec3 p2_06;
  vec3 p1_06;
  vec3 p2_07;
  vec3 p1_07;
  vec3 p2_08;
  vec3 p1_08;
  vec3 p2_09;
  vec3 p1_09;
  vec3 p1_10;
  vec3 p_00;
  vec3 p_01;
  vec3 p_02;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar5;
  byte bVar6;
  _Ios_Openmode __a;
  ulong uVar7;
  long lVar8;
  unsigned_short *puVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  byte *pbVar13;
  reference pvVar14;
  reference pvVar15;
  size_type sVar16;
  ostream *poVar17;
  void *pvVar18;
  float *pfVar19;
  uint *data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vec3 vVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_fa8;
  allocator<char> local_bc9;
  value_type local_bc8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ba3;
  undefined1 local_ba2;
  allocator<char> local_ba1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  undefined1 local_b78 [47];
  allocator<char> local_b49;
  string local_b48;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b25;
  undefined1 local_b24;
  allocator<char> local_b23;
  allocator<char> local_b22;
  allocator<char> local_b21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  string local_af8 [32];
  string local_ad8 [32];
  undefined1 local_ab8 [47];
  allocator<char> local_a89;
  string local_a88;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a65;
  undefined1 local_a64;
  allocator<char> local_a63;
  allocator<char> local_a62;
  allocator<char> local_a61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  string local_a38 [32];
  string local_a18 [32];
  undefined1 local_9f8 [47];
  allocator<char> local_9c9;
  string local_9c8;
  PlyFile local_9a8;
  PlyFile meshFile;
  ostream outstream_binary;
  string local_890;
  allocator<char> local_869;
  undefined1 local_868 [8];
  string path;
  filebuf fb_binary;
  path local_758;
  uint *local_730;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_728;
  undefined8 local_720;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_718;
  undefined8 local_710;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_708;
  undefined8 local_700;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_6f8;
  undefined8 local_6f0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_6e8;
  undefined8 local_6e0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_6d8;
  undefined8 local_6d0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_6c8;
  undefined8 local_6c0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_6b8;
  undefined8 local_6b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_6a8;
  undefined8 local_6a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_698;
  undefined8 local_690;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_688;
  undefined8 local_680;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_678;
  undefined8 local_670;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_668;
  undefined1 local_664 [8];
  array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> ns;
  uint64_t oldSize;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> triangle;
  uint64_t n;
  vec3 vertlist [12];
  ushort local_14a;
  uint16_t cubeIndex;
  double cell [8];
  vec3 p [8];
  double s;
  double z;
  double y;
  double x;
  uint16_t i;
  uint16_t j;
  uint16_t k;
  uint64_t nbEchant;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<float,_std::allocator<float>_> normals;
  vector<float,_std::allocator<float>_> vertices;
  uint64_t iteration_local;
  Field<double,_unsigned_short> *F_local;
  MarchingCube *this_local;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nbEchant);
  uVar7 = (ulong)Config::N;
  for (x._6_2_ = 0; x._6_2_ < uVar7; x._6_2_ = x._6_2_ + 1) {
    for (x._4_2_ = 0; x._4_2_ < uVar7; x._4_2_ = x._4_2_ + 1) {
      for (x._2_2_ = 0; x._2_2_ < uVar7; x._2_2_ = x._2_2_ + 1) {
        lVar8 = uVar7 - 1;
        auVar20._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar20._0_8_ = lVar8;
        auVar20._12_4_ = 0x45300000;
        puVar9 = Field<double,_unsigned_short>::x(F);
        dVar2 = ((double)x._2_2_ /
                ((auVar20._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) *
                (double)(int)(*puVar9 - 1);
        lVar8 = uVar7 - 1;
        auVar21._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar21._0_8_ = lVar8;
        auVar21._12_4_ = 0x45300000;
        puVar9 = Field<double,_unsigned_short>::y(F);
        dVar3 = ((double)x._4_2_ /
                ((auVar21._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) *
                (double)(int)(*puVar9 - 1);
        lVar8 = uVar7 - 1;
        auVar22._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar22._0_8_ = lVar8;
        auVar22._12_4_ = 0x45300000;
        puVar9 = Field<double,_unsigned_short>::z(F);
        dVar4 = ((double)x._6_2_ /
                ((auVar22._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) *
                (double)(int)(*puVar9 - 1);
        p[7].field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
        p[7].field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x3fe00000;
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)(cell + 7),dVar2 - 0.5,dVar3 + 0.5,dVar4 - 0.5)
        ;
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&p[0].field_1,dVar2 + 0.5,dVar3 + 0.5,
                   dVar4 - 0.5);
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&p[1].field_1,dVar2 + 0.5,dVar3 - 0.5,
                   dVar4 - 0.5);
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&p[2].field_1,dVar2 - 0.5,dVar3 - 0.5,
                   dVar4 - 0.5);
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&p[3].field_1,dVar2 - 0.5,dVar3 + 0.5,
                   dVar4 + 0.5);
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&p[4].field_1,dVar2 + 0.5,dVar3 + 0.5,
                   dVar4 + 0.5);
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&p[5].field_1,dVar2 + 0.5,dVar3 - 0.5,
                   dVar4 + 0.5);
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&p[6].field_1,dVar2 - 0.5,dVar3 - 0.5,
                   dVar4 + 0.5);
        dVar2 = interp(this,F,(double)cell[7]._0_4_,(double)cell[7]._4_4_,(double)p[0].field_0.x);
        cell[0] = interp(this,F,(double)p[0].field_1.y,(double)p[0].field_2.z,(double)p[1].field_0.x
                        );
        cell[1] = interp(this,F,(double)p[1].field_1.y,(double)p[1].field_2.z,(double)p[2].field_0.x
                        );
        cell[2] = interp(this,F,(double)p[2].field_1.y,(double)p[2].field_2.z,(double)p[3].field_0.x
                        );
        cell[3] = interp(this,F,(double)p[3].field_1.y,(double)p[3].field_2.z,(double)p[4].field_0.x
                        );
        cell[4] = interp(this,F,(double)p[4].field_1.y,(double)p[4].field_2.z,(double)p[5].field_0.x
                        );
        cell[5] = interp(this,F,(double)p[5].field_1.y,(double)p[5].field_2.z,(double)p[6].field_0.x
                        );
        cell[6] = interp(this,F,(double)p[6].field_1.y,(double)p[6].field_2.z,(double)p[7].field_0.x
                        );
        local_14a = (ushort)(dVar2 < 0.0);
        if (cell[0] < 0.0) {
          local_14a = local_14a | 2;
        }
        if (cell[1] < 0.0) {
          local_14a = local_14a | 4;
        }
        if (cell[2] < 0.0) {
          local_14a = local_14a | 8;
        }
        if (cell[3] < 0.0) {
          local_14a = local_14a | 0x10;
        }
        if (cell[4] < 0.0) {
          local_14a = local_14a | 0x20;
        }
        if (cell[5] < 0.0) {
          local_14a = local_14a | 0x40;
        }
        if (cell[6] < 0.0) {
          local_14a = local_14a | 0x80;
        }
        pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
        if (*pvVar10 != 0) {
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 1) != 0) {
            p1_10.field_1.y = cell[7]._4_4_;
            p1_10.field_0.x = cell[7]._0_4_;
            vVar23.field_1.y = p[0].field_2.z;
            vVar23.field_0.x = p[0].field_1.y;
            p1_10.field_2.z = p[0].field_0.x;
            vVar23.field_2.z = p[1].field_0.x;
            vVar23 = vInterp(this,p1_10,vVar23,(float)dVar2,(float)cell[0]);
            vertlist[0].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 2) != 0) {
            p1_09.field_1.y = p[0].field_2.z;
            p1_09.field_0.x = p[0].field_1.y;
            p2_09.field_1.y = p[1].field_2.z;
            p2_09.field_0.x = p[1].field_1.y;
            p1_09.field_2.z = p[1].field_0.x;
            p2_09.field_2.z = p[2].field_0.x;
            vVar23 = vInterp(this,p1_09,p2_09,(float)cell[0],(float)cell[1]);
            vertlist[1].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[0]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 4) != 0) {
            p1_08.field_1.y = p[1].field_2.z;
            p1_08.field_0.x = p[1].field_1.y;
            p2_08.field_1.y = p[2].field_2.z;
            p2_08.field_0.x = p[2].field_1.y;
            p1_08.field_2.z = p[2].field_0.x;
            p2_08.field_2.z = p[3].field_0.x;
            vVar23 = vInterp(this,p1_08,p2_08,(float)cell[1],(float)cell[2]);
            vertlist[2].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[1]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 8) != 0) {
            p1_07.field_1.y = p[2].field_2.z;
            p1_07.field_0.x = p[2].field_1.y;
            p2_07.field_1.y = cell[7]._4_4_;
            p2_07.field_0.x = cell[7]._0_4_;
            p1_07.field_2.z = p[3].field_0.x;
            p2_07.field_2.z = p[0].field_0.x;
            vVar23 = vInterp(this,p1_07,p2_07,(float)cell[2],(float)dVar2);
            vertlist[3].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[2]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 0x10) != 0) {
            p1_06.field_1.y = p[3].field_2.z;
            p1_06.field_0.x = p[3].field_1.y;
            p2_06.field_1.y = p[4].field_2.z;
            p2_06.field_0.x = p[4].field_1.y;
            p1_06.field_2.z = p[4].field_0.x;
            p2_06.field_2.z = p[5].field_0.x;
            vVar23 = vInterp(this,p1_06,p2_06,(float)cell[3],(float)cell[4]);
            vertlist[4].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[3]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 0x20) != 0) {
            p1_05.field_1.y = p[4].field_2.z;
            p1_05.field_0.x = p[4].field_1.y;
            p2_05.field_1.y = p[5].field_2.z;
            p2_05.field_0.x = p[5].field_1.y;
            p1_05.field_2.z = p[5].field_0.x;
            p2_05.field_2.z = p[6].field_0.x;
            vVar23 = vInterp(this,p1_05,p2_05,(float)cell[4],(float)cell[5]);
            vertlist[5].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[4]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 0x40) != 0) {
            p1_04.field_1.y = p[5].field_2.z;
            p1_04.field_0.x = p[5].field_1.y;
            p2_04.field_1.y = p[6].field_2.z;
            p2_04.field_0.x = p[6].field_1.y;
            p1_04.field_2.z = p[6].field_0.x;
            p2_04.field_2.z = p[7].field_0.x;
            vVar23 = vInterp(this,p1_04,p2_04,(float)cell[5],(float)cell[6]);
            vertlist[6].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[5]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 0x80) != 0) {
            p1_03.field_1.y = p[6].field_2.z;
            p1_03.field_0.x = p[6].field_1.y;
            p2_03.field_1.y = p[3].field_2.z;
            p2_03.field_0.x = p[3].field_1.y;
            p1_03.field_2.z = p[7].field_0.x;
            p2_03.field_2.z = p[4].field_0.x;
            vVar23 = vInterp(this,p1_03,p2_03,(float)cell[6],(float)cell[3]);
            vertlist[7].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[6]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 0x100) != 0) {
            p1_02.field_1.y = cell[7]._4_4_;
            p1_02.field_0.x = cell[7]._0_4_;
            p2_02.field_1.y = p[3].field_2.z;
            p2_02.field_0.x = p[3].field_1.y;
            p1_02.field_2.z = p[0].field_0.x;
            p2_02.field_2.z = p[4].field_0.x;
            vVar23 = vInterp(this,p1_02,p2_02,(float)dVar2,(float)cell[3]);
            vertlist[8].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[7]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 0x200) != 0) {
            p1_01.field_1.y = p[0].field_2.z;
            p1_01.field_0.x = p[0].field_1.y;
            p2_01.field_1.y = p[4].field_2.z;
            p2_01.field_0.x = p[4].field_1.y;
            p1_01.field_2.z = p[1].field_0.x;
            p2_01.field_2.z = p[5].field_0.x;
            vVar23 = vInterp(this,p1_01,p2_01,(float)cell[0],(float)cell[4]);
            vertlist[9].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[8]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 0x400) != 0) {
            p1_00.field_1.y = p[1].field_2.z;
            p1_00.field_0.x = p[1].field_1.y;
            p2_00.field_1.y = p[5].field_2.z;
            p2_00.field_0.x = p[5].field_1.y;
            p1_00.field_2.z = p[2].field_0.x;
            p2_00.field_2.z = p[6].field_0.x;
            vVar23 = vInterp(this,p1_00,p2_00,(float)cell[1],(float)cell[5]);
            vertlist[10].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[9]._4_8_ = vVar23._0_8_;
          }
          pvVar10 = std::array<unsigned_short,_256UL>::operator[](&_edgeTable,(ulong)local_14a);
          if ((*pvVar10 & 0x800) != 0) {
            p1.field_1.y = p[2].field_2.z;
            p1.field_0.x = p[2].field_1.y;
            p2.field_1.y = p[6].field_2.z;
            p2.field_0.x = p[6].field_1.y;
            p1.field_2.z = p[3].field_0.x;
            p2.field_2.z = p[7].field_0.x;
            vVar23 = vInterp(this,p1,p2,(float)cell[2],(float)cell[6]);
            vertlist[0xb].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar23.field_2;
            vertlist[10]._4_8_ = vVar23._0_8_;
          }
          triangle._M_elems[2].field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
          triangle._M_elems[2].field_2 =
               (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
          while( true ) {
            pvVar11 = std::array<std::array<char,_16UL>,_256UL>::operator[]
                                (&_triTable,(ulong)local_14a);
            pvVar12 = std::array<char,_16UL>::operator[](pvVar11,triangle._M_elems[2]._4_8_);
            if (*pvVar12 == -1) break;
            pvVar11 = std::array<std::array<char,_16UL>,_256UL>::operator[]
                                (&_triTable,(ulong)local_14a);
            pbVar13 = (byte *)std::array<char,_16UL>::operator[](pvVar11,triangle._M_elems[2]._4_8_)
            ;
            bVar6 = *pbVar13;
            this_01 = (array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)((long)&oldSize + 4);
            pvVar14 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[](this_01,0);
            pvVar14->field_2 =
                 *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                  (vertlist + bVar6);
            aVar5 = vertlist[(ulong)bVar6 - 1].field_2;
            pvVar14->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                 vertlist[(ulong)bVar6 - 1].field_1;
            pvVar14->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)aVar5
            ;
            pvVar11 = std::array<std::array<char,_16UL>,_256UL>::operator[]
                                (&_triTable,(ulong)local_14a);
            pbVar13 = (byte *)std::array<char,_16UL>::operator[]
                                        (pvVar11,triangle._M_elems[2]._4_8_ + 1);
            bVar6 = *pbVar13;
            pvVar14 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[](this_01,1);
            pvVar14->field_2 =
                 *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                  (vertlist + bVar6);
            aVar5 = vertlist[(ulong)bVar6 - 1].field_2;
            pvVar14->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                 vertlist[(ulong)bVar6 - 1].field_1;
            pvVar14->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)aVar5
            ;
            pvVar11 = std::array<std::array<char,_16UL>,_256UL>::operator[]
                                (&_triTable,(ulong)local_14a);
            pbVar13 = (byte *)std::array<char,_16UL>::operator[]
                                        (pvVar11,triangle._M_elems[2]._4_8_ + 2);
            bVar6 = *pbVar13;
            pvVar14 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[](this_01,2);
            pvVar14->field_2 =
                 *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                  (vertlist + bVar6);
            aVar5 = vertlist[(ulong)bVar6 - 1].field_2;
            pvVar14->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                 vertlist[(ulong)bVar6 - 1].field_1;
            pvVar14->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)aVar5
            ;
            ppfVar1 = &normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            ns._M_elems[2]._4_8_ =
                 std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)ppfVar1);
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)ppfVar1,ns._M_elems[2]._4_8_ + 9);
            pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)
                                 &normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,ns._M_elems[2]._4_8_);
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)(pvVar15 + 8) =
                 triangle._M_elems[2].field_0;
            *(undefined8 *)(pvVar15 + 4) = triangle._M_elems._8_8_;
            pvVar15[6] = (value_type)triangle._M_elems[1].field_1;
            pvVar15[7] = (value_type)triangle._M_elems[1].field_2;
            *(undefined8 *)pvVar15 = stack0xfffffffffffff9cc;
            pvVar15[2] = (value_type)triangle._M_elems[0].field_0;
            pvVar15[3] = (value_type)triangle._M_elems[0].field_1;
            pvVar14 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)
                                 ((long)&oldSize + 4),0);
            local_688 = pvVar14->field_2;
            local_690._0_4_ = pvVar14->field_0;
            local_690._4_4_ = pvVar14->field_1;
            p_00.field_0 = pvVar14->field_0;
            p_00.field_1 = pvVar14->field_1;
            p_00.field_2 = pvVar14->field_2;
            local_680 = local_690;
            local_678 = local_688;
            vVar23 = computeNormal(this,F,p_00);
            local_698 = vVar23.field_2;
            local_6a0 = vVar23._0_8_;
            local_670 = local_6a0;
            local_668 = local_698;
            pvVar14 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)local_664,0);
            pvVar14->field_2 = local_668;
            pvVar14->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                 (undefined4)local_670;
            pvVar14->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_670._4_4_;
            pvVar14 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)
                                 ((long)&oldSize + 4),1);
            local_6c8 = pvVar14->field_2;
            local_6d0._0_4_ = pvVar14->field_0;
            local_6d0._4_4_ = pvVar14->field_1;
            p_01.field_0 = pvVar14->field_0;
            p_01.field_1 = pvVar14->field_1;
            p_01.field_2 = pvVar14->field_2;
            local_6c0 = local_6d0;
            local_6b8 = local_6c8;
            vVar23 = computeNormal(this,F,p_01);
            local_6d8 = vVar23.field_2;
            local_6e0 = vVar23._0_8_;
            local_6b0 = local_6e0;
            local_6a8 = local_6d8;
            pvVar14 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)local_664,1);
            pvVar14->field_2 = local_6a8;
            pvVar14->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                 (undefined4)local_6b0;
            pvVar14->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_6b0._4_4_;
            pvVar14 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)
                                 ((long)&oldSize + 4),2);
            local_708 = pvVar14->field_2;
            local_710._0_4_ = pvVar14->field_0;
            local_710._4_4_ = pvVar14->field_1;
            p_02.field_0 = pvVar14->field_0;
            p_02.field_1 = pvVar14->field_1;
            p_02.field_2 = pvVar14->field_2;
            local_700 = local_710;
            local_6f8 = local_708;
            vVar23 = computeNormal(this,F,p_02);
            local_718 = vVar23.field_2;
            local_720 = vVar23._0_8_;
            local_6f0 = local_720;
            local_6e8 = local_718;
            pvVar14 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                                ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)local_664,2);
            pvVar14->field_2 = local_6e8;
            pvVar14->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                 (undefined4)local_6f0;
            pvVar14->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_6f0._4_4_;
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)
                       &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,ns._M_elems[2]._4_8_ + 9);
            pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)
                                 &indices.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 ns._M_elems[2]._4_8_);
            memcpy(pvVar15,local_664,0x24);
            triangle._M_elems[2]._4_8_ = triangle._M_elems[2]._4_8_ + 3;
          }
        }
      }
    }
  }
  sVar16 = std::vector<float,_std::allocator<float>_>::size
                     ((vector<float,_std::allocator<float>_> *)
                      &normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nbEchant,sVar16 / 3);
  local_728._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nbEchant);
  local_730 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nbEchant);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
            (local_728,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_730,0);
  std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
            (&local_758,(char (*) [11])"result-ply",auto_format);
  std::filesystem::create_directory(&local_758);
  std::filesystem::__cxx11::path::~path(&local_758);
  std::filebuf::filebuf((void *)((long)&path.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_868,"result-ply/",&local_869);
  std::allocator<char>::~allocator(&local_869);
  std::__cxx11::to_string(&local_890,iteration);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868,
             &local_890);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868,".ply");
  __a = std::operator|(_S_out,_S_trunc);
  std::operator|(__a,_S_bin);
  lVar8 = std::filebuf::open((string *)(path.field_2._M_local_buf + 8),(_Ios_Openmode)local_868);
  if (lVar8 == 0) {
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[41m\x1b[1m[ERROR]\x1b[49m\x1b[0m ");
    std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
    poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFILE\x1b[0m    : ");
    poVar17 = std::operator<<(poVar17,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/tmarrec[P]fluid-simulation/src/MarchingCube.cpp"
                             );
    std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
    poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFUNCTION\x1b[0m: ");
    poVar17 = std::operator<<(poVar17,"run");
    std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
    poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[1mLINE\x1b[0m    : ");
    pvVar18 = (void *)std::ostream::operator<<(poVar17,0xf5);
    std::ostream::operator<<(pvVar18,std::endl<char,std::char_traits<char>>);
    poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[1mMESSAGE\x1b[0m : ");
    poVar17 = std::operator<<(poVar17,"Failed to open filebuf");
    std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  std::ostream::ostream(&meshFile,(streambuf *)(path.field_2._M_local_buf + 8));
  bVar6 = std::ios::fail();
  if ((bVar6 & 1) == 0) {
    tinyply::PlyFile::PlyFile(&local_9a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"vertex",&local_9c9);
    local_a64 = 1;
    local_a60 = &local_a58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a58,"x",&local_a61);
    local_a60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a38,"y",&local_a62);
    local_a60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a18,"z",&local_a63);
    local_a64 = 0;
    local_9f8._0_8_ = &local_a58;
    local_9f8._8_8_ = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_a65);
    __l_01._M_len = local_9f8._8_8_;
    __l_01._M_array = (iterator)local_9f8._0_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_9f8 + 0x10),__l_01,&local_a65);
    ppfVar1 = &normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar16 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)ppfVar1);
    pfVar19 = std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)ppfVar1);
    tinyply::PlyFile::add_properties_to_element
              (&local_9a8,&local_9c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_9f8 + 0x10),FLOAT32,sVar16 / 3,(uint8_t *)pfVar19,INVALID,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_9f8 + 0x10));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_a65);
    local_fa8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8;
    do {
      local_fa8 = local_fa8 + -1;
      std::__cxx11::string::~string((string *)local_fa8);
    } while (local_fa8 != &local_a58);
    std::allocator<char>::~allocator(&local_a63);
    std::allocator<char>::~allocator(&local_a62);
    std::allocator<char>::~allocator(&local_a61);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator(&local_9c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a88,"vertex",&local_a89);
    local_b24 = 1;
    local_b20 = &local_b18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b18,"nx",&local_b21);
    local_b20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_af8,"ny",&local_b22);
    local_b20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_ad8,"nz",&local_b23);
    local_b24 = 0;
    local_ab8._0_8_ = &local_b18;
    local_ab8._8_8_ = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_b25);
    __l_00._M_len = local_ab8._8_8_;
    __l_00._M_array = (iterator)local_ab8._0_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_ab8 + 0x10),__l_00,&local_b25);
    this_00 = &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar16 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)this_00);
    pfVar19 = std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)this_00);
    tinyply::PlyFile::add_properties_to_element
              (&local_9a8,&local_a88,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_ab8 + 0x10),FLOAT32,sVar16 / 3,(uint8_t *)pfVar19,INVALID,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_ab8 + 0x10));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_b25);
    local_1010 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ab8;
    do {
      local_1010 = local_1010 + -1;
      std::__cxx11::string::~string((string *)local_1010);
    } while (local_1010 != &local_b18);
    std::allocator<char>::~allocator(&local_b23);
    std::allocator<char>::~allocator(&local_b22);
    std::allocator<char>::~allocator(&local_b21);
    std::__cxx11::string::~string((string *)&local_a88);
    std::allocator<char>::~allocator(&local_a89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b48,"face",&local_b49);
    local_ba2 = 1;
    local_ba0 = &local_b98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b98,"vertex_indices",&local_ba1);
    local_ba2 = 0;
    local_b78._0_8_ = &local_b98;
    local_b78._8_8_ = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_ba3);
    __l._M_len = local_b78._8_8_;
    __l._M_array = (iterator)local_b78._0_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_b78 + 0x10),__l,&local_ba3);
    sVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nbEchant);
    data = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nbEchant);
    tinyply::PlyFile::add_properties_to_element
              (&local_9a8,&local_b48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_b78 + 0x10),UINT32,sVar16 / 3,(uint8_t *)data,UINT8,3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b78 + 0x10));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_ba3);
    __n = &local_b98;
    local_1058 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b78;
    do {
      local_1058 = local_1058 + -1;
      std::__cxx11::string::~string((string *)local_1058);
    } while (local_1058 != __n);
    std::allocator<char>::~allocator(&local_ba1);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator(&local_b49);
    this_02 = tinyply::PlyFile::get_comments_abi_cxx11_(&local_9a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bc8,"Generated by Tristan Marrec fluid-simulation project.",
               &local_bc9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_02,&local_bc8);
    std::__cxx11::string::~string((string *)&local_bc8);
    std::allocator<char>::~allocator(&local_bc9);
    tinyply::PlyFile::write(&local_9a8,(int)&meshFile,(void *)0x1,(size_t)__n);
    std::filebuf::close();
    tinyply::PlyFile::~PlyFile(&local_9a8);
    std::ostream::~ostream(&meshFile);
    std::__cxx11::string::~string((string *)local_868);
    std::filebuf::~filebuf((void *)((long)&path.field_2 + 8));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nbEchant);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return;
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[41m\x1b[1m[ERROR]\x1b[49m\x1b[0m ");
  std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
  poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFILE\x1b[0m    : ");
  poVar17 = std::operator<<(poVar17,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tmarrec[P]fluid-simulation/src/MarchingCube.cpp"
                           );
  std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
  poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFUNCTION\x1b[0m: ");
  poVar17 = std::operator<<(poVar17,"run");
  std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
  poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[1mLINE\x1b[0m    : ");
  pvVar18 = (void *)std::ostream::operator<<(poVar17,0xfa);
  std::ostream::operator<<(pvVar18,std::endl<char,std::char_traits<char>>);
  poVar17 = std::operator<<((ostream *)&std::cerr,"\x1b[1mMESSAGE\x1b[0m : ");
  poVar17 = std::operator<<(poVar17,"Failed to open res.ply file");
  std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

void MarchingCube::run(
        const Field<double, std::uint16_t>& F,
        const std::uint64_t iteration
    )
{
    std::vector<float> vertices;
    std::vector<float> normals;
    std::vector<std::uint32_t> indices;
    const std::uint64_t nbEchant = static_cast<std::uint64_t>(Config::N);
    // Marching Cube algorithm
    for (std::uint16_t k = 0; k < nbEchant; ++k)
    {
        for (std::uint16_t j = 0; j < nbEchant; ++j)
        {
            for (std::uint16_t i = 0; i < nbEchant; ++i)
            {
                const double x =
                    (static_cast<double>(i)/static_cast<double>(nbEchant-1)) *
                    (F.x()-1);
                const double y =
                    (static_cast<double>(j)/static_cast<double>(nbEchant-1)) *
                    (F.y()-1);
                const double z =
                    (static_cast<double>(k)/static_cast<double>(nbEchant-1)) *
                    (F.z()-1);

                const double s = 0.5;
                const glm::vec3 p[8] =
                {
                    {x-s, y+s, z-s},
                    {x+s, y+s, z-s},
                    {x+s, y-s, z-s},
                    {x-s, y-s, z-s},
                    {x-s, y+s, z+s},
                    {x+s, y+s, z+s},
                    {x+s, y-s, z+s},
                    {x-s, y-s, z+s},
                };
                const double cell[8] =
                {
                    interp(F, p[0].x, p[0].y, p[0].z),
                    interp(F, p[1].x, p[1].y, p[1].z),
                    interp(F, p[2].x, p[2].y, p[2].z),
                    interp(F, p[3].x, p[3].y, p[3].z),
                    interp(F, p[4].x, p[4].y, p[4].z),
                    interp(F, p[5].x, p[5].y, p[5].z),
                    interp(F, p[6].x, p[6].y, p[6].z),
                    interp(F, p[7].x, p[7].y, p[7].z),
                };

                std::uint16_t cubeIndex = 0;
                if (cell[0] < 0.0) cubeIndex |= 1;
                if (cell[1] < 0.0) cubeIndex |= 2;
                if (cell[2] < 0.0) cubeIndex |= 4;
                if (cell[3] < 0.0) cubeIndex |= 8;
                if (cell[4] < 0.0) cubeIndex |= 16;
                if (cell[5] < 0.0) cubeIndex |= 32;
                if (cell[6] < 0.0) cubeIndex |= 64;
                if (cell[7] < 0.0) cubeIndex |= 128;

                // Cube is entirely in/out of the surface
                if (_edgeTable[cubeIndex] != 0)
                {
                    glm::vec3 vertlist[12];
                    // Find the vertices where the surface intersects the cube
                    if (_edgeTable[cubeIndex] & 1)
                        vertlist[0] = vInterp(p[0], p[1], cell[0], cell[1]);
                    if (_edgeTable[cubeIndex] & 2)
                        vertlist[1] = vInterp(p[1], p[2], cell[1], cell[2]);
                    if (_edgeTable[cubeIndex] & 4)
                        vertlist[2] = vInterp(p[2], p[3], cell[2], cell[3]);
                    if (_edgeTable[cubeIndex] & 8)
                        vertlist[3] = vInterp(p[3], p[0], cell[3], cell[0]);
                    if (_edgeTable[cubeIndex] & 16)
                        vertlist[4] = vInterp(p[4], p[5], cell[4], cell[5]);
                    if (_edgeTable[cubeIndex] & 32)
                        vertlist[5] = vInterp(p[5], p[6], cell[5], cell[6]);
                    if (_edgeTable[cubeIndex] & 64)
                        vertlist[6] = vInterp(p[6], p[7], cell[6], cell[7]);
                    if (_edgeTable[cubeIndex] & 128)
                        vertlist[7] = vInterp(p[7], p[4], cell[7], cell[4]);
                    if (_edgeTable[cubeIndex] & 256)
                        vertlist[8] = vInterp(p[0], p[4], cell[0], cell[4]);
                    if (_edgeTable[cubeIndex] & 512)
                        vertlist[9] = vInterp(p[1], p[5], cell[1], cell[5]);
                    if (_edgeTable[cubeIndex] & 1024)
                        vertlist[10] = vInterp(p[2], p[6], cell[2], cell[6]);
                    if (_edgeTable[cubeIndex] & 2048)
                        vertlist[11] = vInterp(p[3], p[7], cell[3], cell[7]);

                    // Create the triangle
                    for (std::uint64_t n = 0;
                        _triTable[cubeIndex][n] != -1;
                        n += 3)
                    {
                        std::array<glm::vec3, 3> triangle;
                        triangle[0] =
                            vertlist[static_cast<std::uint8_t>(
                                _triTable[cubeIndex][n  ]
                            )];
                        triangle[1] =
                            vertlist[static_cast<std::uint8_t>(
                                _triTable[cubeIndex][n+1]
                            )];
                        triangle[2] =
                            vertlist[static_cast<std::uint8_t>(
                                _triTable[cubeIndex][n+2]
                            )];

                        std::uint64_t oldSize = vertices.size();
                        vertices.resize(oldSize+9);
                        memcpy(&vertices[oldSize], &triangle, sizeof(float)*9);

                        std::array<glm::vec3, 3> ns;
                        ns[0] = computeNormal(F, triangle[0]);
                        ns[1] = computeNormal(F, triangle[1]);
                        ns[2] = computeNormal(F, triangle[2]);
                        normals.resize(oldSize+9);
                        memcpy(&normals[oldSize], &ns, sizeof(float)*9);
                    }
                }
            }
        }
    }
    indices.resize(vertices.size()/3);
    std::iota(indices.begin(), indices.end(), 0);

    // Write the resulting mesh in .ply file
    std::filesystem::create_directory("result-ply");
    std::filebuf fb_binary;
    std::string path = "result-ply/";
    path += std::to_string(iteration);
    path += ".ply";
    if (!fb_binary.open(path,
                std::ios::out | std::ios::trunc | std::ios::binary))
    {
        ERROR("Failed to open filebuf");
    }
    std::ostream outstream_binary(&fb_binary);
    if (outstream_binary.fail())
    {
        ERROR("Failed to open res.ply file");
    }

    tinyply::PlyFile meshFile;
    meshFile.add_properties_to_element(
            "vertex",
            {"x", "y", "z"},
            tinyply::Type::FLOAT32,
            vertices.size()/3,
            reinterpret_cast<std::uint8_t*>(vertices.data()),
            tinyply::Type::INVALID,
            0
        );
    meshFile.add_properties_to_element(
            "vertex",
            {"nx", "ny", "nz"},
            tinyply::Type::FLOAT32,
            normals.size()/3,
            reinterpret_cast<std::uint8_t*>(normals.data()),
            tinyply::Type::INVALID,
            0
        );
    meshFile.add_properties_to_element(
            "face",
            {"vertex_indices"},
            tinyply::Type::UINT32,
            indices.size()/3,
            reinterpret_cast<std::uint8_t*>(indices.data()),
            tinyply::Type::UINT8,
            3
        );
    meshFile.get_comments().push_back(
            "Generated by Tristan Marrec fluid-simulation project."
        );

    meshFile.write(outstream_binary, true);
    fb_binary.close();
}